

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

aiCamera * __thiscall
Assimp::BlenderImporter::ConvertCamera
          (BlenderImporter *this,Scene *param_1,Object *obj,Camera *cam,ConversionData *param_4)

{
  float fVar1;
  aiCamera *this_00;
  pointer __p;
  float fVar2;
  __uniq_ptr_impl<aiCamera,_std::default_delete<aiCamera>_> local_20;
  
  this_00 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(this_00);
  aiString::Set((aiString *)this_00,(obj->id).name + 2);
  (this_00->mPosition).x = 0.0;
  (this_00->mPosition).y = 0.0;
  *(undefined8 *)&(this_00->mPosition).z = 0;
  (this_00->mUp).y = 1.0;
  (this_00->mUp).z = 0.0;
  (this_00->mLookAt).x = 0.0;
  (this_00->mLookAt).y = 0.0;
  (this_00->mLookAt).z = -1.0;
  fVar2 = cam->sensor_x;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar1 = cam->lens;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      fVar2 = atan2f(fVar2,fVar1 + fVar1);
      this_00->mHorizontalFOV = fVar2 + fVar2;
    }
  }
  fVar2 = cam->clipend;
  this_00->mClipPlaneNear = cam->clipsta;
  this_00->mClipPlaneFar = fVar2;
  local_20._M_t.super__Tuple_impl<0UL,_aiCamera_*,_std::default_delete<aiCamera>_>.
  super__Head_base<0UL,_aiCamera_*,_false>._M_head_impl =
       (tuple<aiCamera_*,_std::default_delete<aiCamera>_>)
       (_Tuple_impl<0UL,_aiCamera_*,_std::default_delete<aiCamera>_>)0x0;
  std::unique_ptr<aiCamera,_std::default_delete<aiCamera>_>::~unique_ptr
            ((unique_ptr<aiCamera,_std::default_delete<aiCamera>_> *)&local_20);
  return this_00;
}

Assistant:

aiCamera* BlenderImporter::ConvertCamera(const Scene& /*in*/, const Object* obj, const Camera* cam, ConversionData& /*conv_data*/)
{
    std::unique_ptr<aiCamera> out(new aiCamera());
    out->mName = obj->id.name+2;
    out->mPosition = aiVector3D(0.f, 0.f, 0.f);
    out->mUp = aiVector3D(0.f, 1.f, 0.f);
    out->mLookAt = aiVector3D(0.f, 0.f, -1.f);
    if (cam->sensor_x && cam->lens) {
        out->mHorizontalFOV = 2.f * std::atan2(cam->sensor_x,  2.f * cam->lens);
    }
    out->mClipPlaneNear = cam->clipsta;
    out->mClipPlaneFar = cam->clipend;

    return out.release();
}